

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketOnline.cpp
# Opt level: O2

void __thiscall SocketOnline::recv_message(SocketOnline *this,Mat *a)

{
  SOCK sock;
  char *p_00;
  int l;
  char *p;
  
  recv_message_n(this,this->sock,this->header,4);
  sock = this->sock;
  p_00 = this->buffer;
  l = Mat::getStringLen(a);
  recv_message_n(this,sock,p_00,l);
  p = this->buffer;
  Mat::addFrom_pos(a,&p);
  return;
}

Assistant:

void SocketOnline::recv_message(Mat *a) {
    recv_message_n(sock, header, HEADER_LEN);
    recv_message_n(sock, buffer, a->getStringLen());
    char* p = buffer;
    a->addFrom_pos(p);
//    cout << "--------------" << endl;
}